

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_2::AreLayoutCompatibleStructs
               (ValidationState_t *_,Instruction *type1,Instruction *type2)

{
  uint32_t id;
  _Base_ptr p_Var1;
  uint __line;
  bool bVar2;
  Instruction *type1_00;
  Instruction *type2_00;
  pointer psVar3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar4;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  pointer psVar8;
  char *__assertion;
  size_t operand;
  ulong uVar9;
  
  if (((type1->inst_).opcode == 0x1e) && ((type2->inst_).opcode == 0x1e)) {
    psVar3 = (type1->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    psVar8 = (type1->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if ((long)psVar8 - (long)psVar3 ==
        (long)(type2->operands_).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(type2->operands_).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      for (uVar9 = 2; uVar9 < (ulong)((long)psVar8 - (long)psVar3 >> 4); uVar9 = uVar9 + 1) {
        id = (type1->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start[uVar9];
        if (id != (type2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar9]) {
          type1_00 = ValidationState_t::FindDef(_,id);
          type2_00 = ValidationState_t::FindDef
                               (_,(type2->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar9]);
          bVar2 = AreLayoutCompatibleStructs(_,type1_00,type2_00);
          if (!bVar2) {
            return false;
          }
          psVar3 = (type1->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          psVar8 = (type1->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      if ((type1->inst_).opcode == 0x1e) {
        if ((type2->inst_).opcode == 0x1e) {
          psVar4 = ValidationState_t::id_decorations(_,(type1->inst_).result_id);
          psVar5 = ValidationState_t::id_decorations(_,(type2->inst_).result_id);
          p_Var7 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var1 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            bVar2 = (_Rb_tree_header *)p_Var7 == &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
            if (bVar2) {
              return true;
            }
            p_Var6 = p_Var1;
            if (p_Var7[1]._M_color == 0x23) {
              for (; (_Rb_tree_header *)p_Var6 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
                if ((p_Var6[1]._M_color == 0x23) && (p_Var7[2]._M_color == p_Var6[2]._M_color)) {
                  if ((p_Var7[1]._M_parent)->_M_color != (p_Var6[1]._M_parent)->_M_color) {
                    return bVar2;
                  }
                  break;
                }
              }
            }
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          } while( true );
        }
        __assertion = 
        "type2->opcode() == spv::Op::OpTypeStruct && \"type2 must be an OpTypeStruct instruction.\""
        ;
        __line = 0x6b;
      }
      else {
        __assertion = 
        "type1->opcode() == spv::Op::OpTypeStruct && \"type1 must be an OpTypeStruct instruction.\""
        ;
        __line = 0x69;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                    ,__line,
                    "bool spvtools::val::(anonymous namespace)::HaveSameLayoutDecorations(ValidationState_t &, const Instruction *, const Instruction *)"
                   );
    }
  }
  return false;
}

Assistant:

bool AreLayoutCompatibleStructs(ValidationState_t& _, const Instruction* type1,
                                const Instruction* type2) {
  if (type1->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }
  if (type2->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  if (!HaveLayoutCompatibleMembers(_, type1, type2)) return false;

  return HaveSameLayoutDecorations(_, type1, type2);
}